

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_mult_gen(REF_INT n,REF_DBL *a,REF_DBL *b,REF_DBL *r)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
    uVar3 = 0;
    do {
      uVar5 = 0;
      pRVar4 = a;
      do {
        r[uVar3 * uVar1 + uVar5] = 0.0;
        dVar7 = 0.0;
        uVar6 = 0;
        pdVar2 = pRVar4;
        do {
          dVar7 = dVar7 + *pdVar2 * b[uVar6];
          r[uVar3 * uVar1 + uVar5] = dVar7;
          uVar6 = uVar6 + 1;
          pdVar2 = pdVar2 + uVar1;
        } while (uVar1 != uVar6);
        uVar5 = uVar5 + 1;
        pRVar4 = pRVar4 + 1;
      } while (uVar5 != uVar1);
      uVar3 = uVar3 + 1;
      b = b + uVar1;
    } while (uVar3 != uVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_mult_gen(REF_INT n, REF_DBL *a, REF_DBL *b,
                                       REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) {
      r[i + j * n] = 0.0;
      for (k = 0; k < n; k++) r[i + j * n] += a[i + k * n] * b[k + j * n];
    }
  return REF_SUCCESS;
}